

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

uint32_t pm_read_bytes(PmInternal *midi,uchar *data,int len,PmTimestamp timestamp)

{
  byte bVar1;
  PmError PVar2;
  uint32_t uVar3;
  int iVar4;
  bool bVar5;
  uint local_34;
  uchar byte_1;
  PmTimestamp PStack_30;
  uchar byte;
  PmEvent event;
  int i;
  PmTimestamp timestamp_local;
  int len_local;
  uchar *data_local;
  PmInternal *midi_local;
  
  event.message = 0;
  PStack_30 = timestamp;
  event.timestamp = timestamp;
  if (midi == (PmInternal *)0x0) {
    __assert_fail("midi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_common/portmidi.c"
                  ,0x425,
                  "uint32_t pm_read_bytes(PmInternal *, const unsigned char *, int, PmTimestamp)");
  }
  if (len == 0) {
    midi_local._4_4_ = 0;
  }
  else {
    if (midi->sysex_in_progress == 0) {
      while (event.message < len) {
        uVar3 = event.message + 1;
        bVar1 = data[event.message];
        if ((bVar1 == 0xf0) && ((midi->filters & 1U) == 0)) {
          midi->sysex_in_progress = 1;
          break;
        }
        if (bVar1 == 0xf7) {
          midi->sysex_in_progress = 0;
          return uVar3;
        }
        event.message = uVar3;
        if ((bVar1 & 0x80) != 0) {
          local_34 = (uint)bVar1;
          pm_read_short(midi,(PmEvent *)&stack0xffffffffffffffcc);
        }
      }
    }
LAB_0010550c:
    bVar5 = false;
    if (event.message < len) {
      bVar5 = midi->sysex_in_progress != 0;
    }
    if (bVar5) {
      if (((midi->sysex_message_count == 0) && (event.message <= len + -4)) &&
         (local_34 = CONCAT13(data[event.message + 3],
                              CONCAT12(data[event.message + 2],
                                       CONCAT11(data[event.message + 1],data[event.message]))),
         (local_34 & 0x80808080) == 0)) {
        PVar2 = Pm_Enqueue(midi->queue,&stack0xffffffffffffffcc);
        if (PVar2 == pmBufferOverflow) {
          midi->sysex_in_progress = 0;
        }
        event.message = event.message + 4;
      }
      else {
        do {
          do {
            if (len <= event.message) goto LAB_0010550c;
            iVar4 = event.message + 1;
            bVar1 = data[event.message];
            event.message = iVar4;
          } while ((((bVar1 & 0xf8) == 0xf8) && ((bVar1 & 0xf0) == 0xf0)) &&
                  ((1 << (bVar1 & 0xf) & midi->filters) != 0));
          iVar4 = midi->sysex_message_count;
          midi->sysex_message_count = iVar4 + 1;
          midi->sysex_message = (uint)bVar1 << ((byte)(iVar4 << 3) & 0x1f) | midi->sysex_message;
          if (bVar1 == 0xf7) {
            midi->sysex_in_progress = 0;
            pm_flush_sysex(midi,PStack_30);
            return event.message;
          }
        } while (midi->sysex_message_count != 4);
        pm_flush_sysex(midi,PStack_30);
      }
      goto LAB_0010550c;
    }
    midi_local._4_4_ = event.message;
  }
  return midi_local._4_4_;
}

Assistant:

unsigned int pm_read_bytes(PmInternal *midi, const unsigned char *data, 
                    int len, PmTimestamp timestamp)
{
    int i = 0; /* index into data, must not be unsigned (!) */
    PmEvent event;
    event.timestamp = timestamp;
    assert(midi);
    /* note that since buffers may not have multiples of 4 bytes,
     * pm_read_bytes may be called in the middle of an outgoing
     * 4-byte PortMidi message. sysex_in_progress indicates that
     * a sysex has been sent but no eox.
     */
    if (len == 0) return 0; /* sanity check */
    if (!midi->sysex_in_progress) {
        while (i < len) { /* process all data */
            unsigned char byte = data[i++];
            if (byte == MIDI_SYSEX &&
                !pm_realtime_filtered(byte, midi->filters)) {
                midi->sysex_in_progress = TRUE;
                i--; /* back up so code below will get SYSEX byte */
                break; /* continue looping below to process msg */
            } else if (byte == MIDI_EOX) {
                midi->sysex_in_progress = FALSE;
                return i; /* done with one message */
            } else if (byte & MIDI_STATUS_MASK) {
                /* We're getting MIDI but no sysex in progress.
                 * Either the SYSEX status byte was dropped or
                 * the message was filtered. Drop the data, but
                 * send any embedded realtime bytes.
                 */
                /* assume that this is a real-time message:
                 * it is an error to pass non-real-time messages
                 * to pm_read_bytes
                 */
                event.message = byte;
                pm_read_short(midi, &event);
            }
        } /* all bytes in the buffer are processed */
    }
    /* Now, i<len implies sysex_in_progress. If sysex_in_progress
     * becomes false in the loop, there must have been an overflow
     * and we can just drop all remaining bytes 
     */
    while (i < len && midi->sysex_in_progress) {
        if (midi->sysex_message_count == 0 && i <= len - 4 &&
            ((event.message = (((PmMessage) data[i]) | 
                             (((PmMessage) data[i+1]) << 8) |
                             (((PmMessage) data[i+2]) << 16) |
                             (((PmMessage) data[i+3]) << 24))) &
             0x80808080) == 0) { /* all data, no status */ 
            if (Pm_Enqueue(midi->queue, &event) == pmBufferOverflow) {
                midi->sysex_in_progress = FALSE;
            }
            i += 4;
        } else {
            while (i < len) {
                /* send one byte at a time */
                unsigned char byte = data[i++];
                if (is_real_time(byte) && 
                    pm_realtime_filtered(byte, midi->filters)) {
                    continue; /* real-time data is filtered, so omit */
                }
                midi->sysex_message |= 
                    (byte << (8 * midi->sysex_message_count++));
                if (byte == MIDI_EOX) {
                    midi->sysex_in_progress = FALSE;
                    pm_flush_sysex(midi, event.timestamp);
                    return i;
                } else if (midi->sysex_message_count == 4) {
                    pm_flush_sysex(midi, event.timestamp);
                    /* after handling at least one non-data byte
                     * and reaching a 4-byte message boundary,
                     * resume trying to send 4 at a time in outer loop
                     */
                    break;
                }
            }
        }
    }
    return i;
}